

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O1

bool __thiscall cmInstalledFile::GetProperty(cmInstalledFile *this,string *prop,string *value)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  string separator;
  string output;
  undefined1 *local_78;
  char *local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  string *local_38;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
          ::find(&(this->Properties)._M_t,prop);
  p_Var2 = &(this->Properties)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node != p_Var2) {
    local_58 = &local_48;
    local_50 = 0;
    local_48 = 0;
    local_78 = &local_68;
    local_70 = (char *)0x0;
    local_68 = 0;
    p_Var3 = *(_Base_ptr *)(cVar1._M_node + 2);
    local_38 = value;
    if (p_Var3 != cVar1._M_node[2]._M_parent) {
      do {
        std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78);
        std::__cxx11::string::_M_append((char *)&local_58,*(ulong *)(*(long *)p_Var3 + 0x38));
        std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x554ed2);
        p_Var3 = (_Base_ptr)&p_Var3->_M_parent;
      } while (p_Var3 != cVar1._M_node[2]._M_parent);
    }
    std::__cxx11::string::_M_assign((string *)local_38);
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
  }
  return (_Rb_tree_header *)cVar1._M_node != p_Var2;
}

Assistant:

bool cmInstalledFile::GetProperty(const std::string& prop,
                                  std::string& value) const
{
  PropertyMapType::const_iterator i = this->Properties.find(prop);
  if (i == this->Properties.end()) {
    return false;
  }

  Property const& property = i->second;

  std::string output;
  std::string separator;

  for (ExpressionVectorType::const_iterator j =
         property.ValueExpressions.begin();
       j != property.ValueExpressions.end(); ++j) {
    output += separator;
    output += (*j)->GetInput();
    separator = ";";
  }

  value = output;
  return true;
}